

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O3

BOOL Internal_ExtractFormatW
               (CPalThread *pthrCurrent,LPCWSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,
               LPINT Precision,LPINT Prefix,LPINT Type)

{
  int iVar1;
  size_t sVar2;
  char *__nptr;
  int *piVar3;
  LPCWSTR pWVar4;
  WCHAR *pWVar5;
  CHAR CVar6;
  WCHAR WVar7;
  uint uVar8;
  LPSTR pCVar9;
  uint uVar10;
  char *pcVar11;
  BOOL BVar12;
  LPSTR pCVar13;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pWVar4 = *Fmt;
  if (pWVar4 == (LPCWSTR)0x0) {
    return 0;
  }
  if (*pWVar4 != L'%') {
    return 0;
  }
  *Fmt = pWVar4 + 1;
  *Out = '%';
  sVar2 = PAL_wcslen(*Fmt);
  __nptr = (char *)CorUnix::InternalMalloc(sVar2 + 1);
  if (__nptr != (char *)0x0) {
    do {
      pCVar13 = Out + 1;
      pWVar4 = *Fmt;
      WVar7 = *pWVar4;
      uVar10 = (uint)(ushort)WVar7;
      if ((ushort)WVar7 < 0x2b) {
        if (WVar7 == L' ') {
          uVar8 = 8;
        }
        else {
          if (WVar7 != L'#') goto LAB_0011a492;
          uVar8 = 2;
        }
      }
      else if (WVar7 == L'0') {
        uVar8 = 4;
      }
      else {
        uVar8 = 1;
        if (uVar10 != 0x2d) {
          if (uVar10 != 0x2b) goto LAB_0011a492;
          uVar8 = 0x10;
        }
      }
      *Flags = *Flags | uVar8;
      *Fmt = pWVar4 + 1;
      *pCVar13 = (CHAR)WVar7;
      Out = pCVar13;
    } while( true );
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    piVar3 = __errno_location();
    *piVar3 = 8;
    return 0;
  }
  goto LAB_0011a961;
LAB_0011a492:
  if ((~*Flags & 5U) == 0) {
    *Flags = *Flags - 4;
  }
  iVar1 = isdigit(uVar10);
  pWVar4 = *Fmt;
  uVar10 = (uint)(ushort)*pWVar4;
  if (iVar1 != 0) {
    iVar1 = isdigit(uVar10);
    pcVar11 = __nptr;
    while (iVar1 != 0) {
      *pcVar11 = (char)**Fmt;
      pcVar11 = pcVar11 + 1;
      pWVar4 = *Fmt;
      *Fmt = pWVar4 + 1;
      *pCVar13 = (CHAR)*pWVar4;
      pCVar13 = pCVar13 + 1;
      iVar1 = isdigit((uint)(ushort)**Fmt);
    }
    *pcVar11 = '\0';
    iVar1 = atoi(__nptr);
    *Width = iVar1;
    if (-1 < iVar1) goto LAB_0011a580;
LAB_0011a603:
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar3 = __errno_location();
      *piVar3 = 0x54f;
      return 0;
    }
LAB_0011a961:
    abort();
  }
  if (uVar10 == 0x2a) {
    *Width = -2;
    *Fmt = pWVar4 + 1;
    *pCVar13 = '*';
    pCVar13 = Out + 2;
    iVar1 = isdigit((uint)(ushort)**Fmt);
    if (iVar1 != 0) {
      *Width = -3;
      while (iVar1 = isdigit((uint)(ushort)**Fmt), iVar1 != 0) {
        pWVar4 = *Fmt;
        *Fmt = pWVar4 + 1;
        *pCVar13 = (CHAR)*pWVar4;
        pCVar13 = pCVar13 + 1;
      }
    }
  }
LAB_0011a580:
  pCVar9 = pCVar13;
  if (**Fmt == L'.') {
    *Fmt = *Fmt + 1;
    pCVar9 = pCVar13 + 1;
    *pCVar13 = '.';
    iVar1 = isdigit((uint)(ushort)**Fmt);
    pWVar4 = *Fmt;
    uVar10 = (uint)(ushort)*pWVar4;
    if (iVar1 == 0) {
      if (uVar10 == 0x2a) {
        *Precision = -2;
        *Fmt = pWVar4 + 1;
        pCVar13[1] = '*';
        pCVar9 = pCVar13 + 2;
        iVar1 = isdigit((uint)(ushort)**Fmt);
        if (iVar1 != 0) {
          *Precision = -4;
          while (iVar1 = isdigit((uint)(ushort)**Fmt), iVar1 != 0) {
            pWVar4 = *Fmt;
            *Fmt = pWVar4 + 1;
            *pCVar9 = (CHAR)*pWVar4;
            pCVar9 = pCVar9 + 1;
          }
        }
      }
      else {
        *Precision = -3;
      }
    }
    else {
      iVar1 = isdigit(uVar10);
      pcVar11 = __nptr;
      while (iVar1 != 0) {
        *pcVar11 = (char)**Fmt;
        pcVar11 = pcVar11 + 1;
        pWVar4 = *Fmt;
        *Fmt = pWVar4 + 1;
        *pCVar9 = (CHAR)*pWVar4;
        pCVar9 = pCVar9 + 1;
        iVar1 = isdigit((uint)(ushort)**Fmt);
      }
      *pcVar11 = '\0';
      iVar1 = atoi(__nptr);
      *Precision = iVar1;
      if (iVar1 < 0) goto LAB_0011a603;
    }
  }
  pWVar4 = *Fmt;
  WVar7 = *pWVar4;
  pWVar5 = pWVar4;
  if ((ushort)WVar7 < 0x6c) {
    if (WVar7 == L'I') {
      if (pWVar4[1] == L'3') {
        if (pWVar4[2] == L'2') {
          pWVar5 = pWVar4 + 3;
          goto LAB_0011a6b6;
        }
LAB_0011a732:
        pWVar5 = pWVar4 + 1;
      }
      else {
        if ((pWVar4[1] != L'6') || (pWVar4[2] != L'4')) goto LAB_0011a732;
        pWVar5 = pWVar4 + 3;
      }
      *Fmt = pWVar5;
      *Prefix = 3;
    }
    else {
      if (WVar7 != L'L') {
        if (WVar7 != L'h') goto LAB_0011a748;
        *Prefix = 1;
      }
      pWVar5 = pWVar4 + 1;
LAB_0011a6b6:
      *Fmt = pWVar5;
    }
LAB_0011a742:
    WVar7 = *pWVar5;
LAB_0011a748:
    if (0x52 < (ushort)WVar7) {
      pWVar4 = pWVar5;
      BVar12 = 0;
      switch(WVar7) {
      case L'c':
        goto switchD_0011a76d_caseD_63;
      case L'e':
      case L'f':
      case L'g':
switchD_0011a76d_caseD_65:
        if (*Prefix == 4) {
          *Prefix = 2;
        }
        *Type = 7;
        *Fmt = pWVar5 + 1;
        *pCVar9 = (CHAR)WVar7;
        break;
      case L'h':
      case L'j':
      case L'k':
      case L'l':
      case L'm':
      case L'q':
      case L'r':
      case L't':
      case L'v':
      case L'w':
        goto switchD_0011a76d_caseD_68;
      case L'n':
        if (*Prefix == 1) {
          *pCVar9 = 'h';
          pCVar9 = pCVar9 + 1;
          pWVar5 = *Fmt;
          CVar6 = (CHAR)*pWVar5;
        }
        else {
          CVar6 = 'n';
          if (*Prefix == 4) {
            *Prefix = 2;
          }
        }
        *Fmt = pWVar5 + 1;
        *pCVar9 = CVar6;
        pCVar9 = pCVar9 + 1;
        *Type = 6;
        goto LAB_0011a918;
      case L'p':
        goto switchD_0011a76d_caseD_70;
      case L's':
switchD_0011a76d_caseD_73:
        *Type = WVar7 == L'S' | 2;
        if (*Prefix != 1) {
          if (WVar7 == L's') {
            *Prefix = 2;
          }
          else if (*Prefix != 2) goto LAB_0011a90d;
          *pCVar9 = 'l';
          pCVar9 = pCVar9 + 1;
        }
LAB_0011a90d:
        *pCVar9 = 's';
        goto LAB_0011a911;
      default:
        if (WVar7 == L'S') goto switchD_0011a76d_caseD_73;
        BVar12 = 0;
        if (WVar7 != L'X') goto switchD_0011a76d_caseD_68;
      case L'd':
      case L'i':
      case L'o':
      case L'u':
      case L'x':
        *Type = 4;
        switch(*Prefix) {
        case 1:
          *pCVar9 = 'h';
          pCVar9 = pCVar9 + 1;
          break;
        case 2:
        case 4:
          *pCVar9 = 'l';
          pCVar9 = pCVar9 + 1;
          *Prefix = 2;
          break;
        case 3:
          pCVar9[0] = 'l';
          pCVar9[1] = 'l';
          pCVar9 = pCVar9 + 2;
        }
        pWVar4 = *Fmt;
        *Fmt = pWVar4 + 1;
        *pCVar9 = (CHAR)*pWVar4;
      }
      goto LAB_0011a8e6;
    }
    if (WVar7 != L'C') {
      if ((WVar7 != L'E') && (BVar12 = 0, WVar7 != L'G')) goto switchD_0011a76d_caseD_68;
      goto switchD_0011a76d_caseD_65;
    }
switchD_0011a76d_caseD_63:
    *Type = 1;
    iVar1 = *Prefix;
    if ((iVar1 != 1) && (((WVar7 == L'c' || (iVar1 == 4)) || (iVar1 == 2)))) {
      *pCVar9 = 'l';
      pCVar9 = pCVar9 + 1;
      *Prefix = 2;
    }
    *pCVar9 = 'c';
LAB_0011a911:
    pCVar9 = pCVar9 + 1;
    *Fmt = *Fmt + 1;
  }
  else {
    if ((WVar7 == L'l') || (WVar7 == L'w')) {
      pWVar5 = pWVar4 + 1;
      *Fmt = pWVar5;
      WVar7 = pWVar4[1];
      if (WVar7 != L'C') {
        if (WVar7 == L'l') {
          *Prefix = 3;
          pWVar5 = pWVar4 + 2;
          goto LAB_0011a6b6;
        }
        if (WVar7 != L'S') goto LAB_0011a748;
      }
      *Prefix = 4;
      goto LAB_0011a742;
    }
    if (WVar7 != L'p') goto LAB_0011a748;
    *Prefix = 3;
switchD_0011a76d_caseD_70:
    *Type = 5;
    *Fmt = pWVar4 + 1;
    iVar1 = *Prefix;
    if (iVar1 == 3) {
      if (*Precision == -1) {
        *Precision = 0x10;
        pCVar9[0] = '.';
        pCVar9[1] = '1';
        pCVar9[2] = '6';
        pCVar9 = pCVar9 + 3;
      }
      pCVar9[0] = 'l';
      pCVar9[1] = 'l';
      pCVar9 = pCVar9 + 2;
    }
    else {
      if (*Precision == -1) {
        *Precision = 8;
        pCVar9[0] = '.';
        pCVar9[1] = '8';
        pCVar9 = pCVar9 + 2;
        iVar1 = *Prefix;
      }
      if (iVar1 == 4) {
        *Prefix = 2;
      }
    }
    *pCVar9 = 'X';
LAB_0011a8e6:
    pCVar9 = pCVar9 + 1;
  }
LAB_0011a918:
  BVar12 = 1;
switchD_0011a76d_caseD_68:
  *pCVar9 = '\0';
  CorUnix::InternalFree(__nptr);
  return BVar12;
}

Assistant:

BOOL Internal_ExtractFormatW(CPalThread *pthrCurrent, LPCWSTR *Fmt, LPSTR Out, LPINT Flags,
    LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = (CHAR) *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) InternalMalloc(PAL_wcslen(*Fmt)+1);
    if (!TempStr)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
            case '-':
                *Flags |= PFF_MINUS; break;
            case '+':
                *Flags |= PFF_PLUS; break;
            case '0':
                *Flags |= PFF_ZERO; break;
            case ' ':
                *Flags |= PFF_SPACE; break;
            case '#':
                *Flags |= PFF_POUND; break;
        }
            *Out++ = (CHAR) *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit(**Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit(**Fmt))
        {
            *TempStrPtr++ = (CHAR) **Fmt;
            *Out++ = (CHAR) *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            ERROR("atoi returned a negative value indicative of an overflow.\n");
            pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = (CHAR) *(*Fmt)++;
        if (isdigit(**Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit(**Fmt))
            {
                *Out++ = (CHAR) *(*Fmt)++;
            }
        }
    }

    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = (CHAR) *(*Fmt)++;
        if (isdigit(**Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit(**Fmt))
            {
                *TempStrPtr++ = (CHAR) **Fmt;
                *Out++ = (CHAR) *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                ERROR("atoi returned a negative value indicative of an overflow.\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = (CHAR) *(*Fmt)++;
            if (isdigit(**Fmt))
            {
                /* this is an invalid precision because we have a .* then a number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit(**Fmt))
                {
                    *Out++ = (CHAR) *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    if ((*Fmt)[0] == 'I')
    {
        /* grab prefix of 'I64' for __int64 */
        if ((*Fmt)[1] == '6' && (*Fmt)[2] == '4')
        {
            /* convert to 'll' so that Unix snprintf can handle it */
            *Fmt += 3;
            *Prefix = PFF_PREFIX_LONGLONG;
        }
        /* grab prefix of 'I32' for __int32 */
        else if ((*Fmt)[1] == '3' && (*Fmt)[2] == '2')
        {
            *Fmt += 3;
        }
        else
        {
            ++(*Fmt);
    #ifdef BIT64
            /* convert to 'll' so that Unix snprintf can handle it */
            *Prefix = PFF_PREFIX_LONGLONG;
    #endif
        }
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
 #ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'C' || **Fmt == 'S')
#endif
        {
            *Prefix = PFF_PREFIX_LONG_W;
        }
        if (**Fmt == 'l')
        {
            *Prefix = PFF_PREFIX_LONGLONG;
            ++(*Fmt);
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }


    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'c')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG || *Prefix == PFF_PREFIX_LONG_W)
        {
            *Out++ = 'l';
            *Prefix = PFF_PREFIX_LONG;
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S' )
    {
        if ( **Fmt == 'S' )
        {
           *Type = PFF_TYPE_WSTRING;
        }
        else
        {
            *Type = PFF_TYPE_STRING;
        }
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 's')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }

        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG || *Prefix == PFF_PREFIX_LONG_W)
        {
            *Out++ = 'l';
            *Prefix = PFF_PREFIX_LONG;
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        if (*Prefix == PFF_PREFIX_LONG_W)
        {
            *Prefix = PFF_PREFIX_LONG;
        }

        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_LONG_W)
        {
            *Prefix = PFF_PREFIX_LONG;
        }

        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        (*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
                *Out++ = '.';
                *Out++ = '1';
                *Out++ = '6';
            }
            /* native *printf does not support %I64p
               (actually %llp), so we need to cheat a little bit */
            *Out++ = 'l';
            *Out++ = 'l';
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
                *Out++ = '.';
                *Out++ = '8';
            }
            if (*Prefix == PFF_PREFIX_LONG_W)
            {
                *Prefix = PFF_PREFIX_LONG;
            }
        }
        *Out++ = 'X';
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    InternalFree(TempStr);
    return Result;
}